

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

state parse_url_char_(state s,char ch)

{
  char ch_local;
  state s_local;
  
  if (((ch == ' ') || (ch == '\r')) || (ch == '\n')) {
    return s_dead;
  }
  if ((ch == '\t') || (ch == '\f')) {
    return s_dead;
  }
  switch(s) {
  case s_req_spaces_before_url:
    if ((ch == '/') || (ch == '*')) {
      return s_req_path;
    }
    if ((0x60 < (byte)(ch | 0x20U)) && ((byte)(ch | 0x20U) < 0x7b)) {
      return s_req_schema;
    }
    break;
  case s_req_schema:
    if ((0x60 < (byte)(ch | 0x20U)) && ((byte)(ch | 0x20U) < 0x7b)) {
      return s;
    }
    if (ch == ':') {
      return s_req_schema_slash;
    }
    break;
  case s_req_schema_slash:
    if (ch == '/') {
      return s_req_schema_slash_slash;
    }
    break;
  case s_req_schema_slash_slash:
    if (ch == '/') {
      return s_req_server_start;
    }
    break;
  case s_req_server_with_at:
    if (ch == '@') {
      return s_dead;
    }
  case s_req_server_start:
  case s_req_server:
    if (ch == '/') {
      return s_req_path;
    }
    if (ch == '?') {
      return s_req_query_string_start;
    }
    if (ch == '@') {
      return s_req_server_with_at;
    }
    if ((((((0x60 < (byte)(ch | 0x20U)) && ((byte)(ch | 0x20U) < 0x7b)) ||
          (('/' < ch && (ch < ':')))) ||
         (((((ch == '-' || (ch == '_')) || (ch == '.')) || ((ch == '!' || (ch == '~')))) ||
          (ch == '*')))) || ((ch == '\'' || (ch == '(')))) ||
       ((((ch == ')' || (((ch == '%' || (ch == ';')) || (ch == ':')))) ||
         (((ch == '&' || (ch == '=')) || (ch == '+')))) ||
        (((ch == '$' || (ch == ',')) || ((ch == '[' || (ch == ']')))))))) {
      return s_req_server;
    }
    break;
  case s_req_path:
    if (((uint)""[(byte)ch >> 3] & 1 << (ch & 7U)) != 0) {
      return s;
    }
    if (ch == '#') {
      return s_req_fragment_start;
    }
    if (ch == '?') {
      return s_req_query_string_start;
    }
    break;
  case s_req_query_string_start:
  case s_req_query_string:
    if (((uint)""[(byte)ch >> 3] & 1 << (ch & 7U)) != 0) {
      return s_req_query_string;
    }
    if (ch == '#') {
      return s_req_fragment_start;
    }
    if (ch == '?') {
      return s_req_query_string;
    }
    break;
  case s_req_fragment_start:
    if (((uint)""[(byte)ch >> 3] & 1 << (ch & 7U)) != 0) {
      return s_req_fragment;
    }
    if (ch == '#') {
      return s;
    }
    if (ch == '?') {
      return s_req_fragment;
    }
    break;
  case s_req_fragment:
    if (((uint)""[(byte)ch >> 3] & 1 << (ch & 7U)) != 0) {
      return s;
    }
    if (ch == '#') {
      return s;
    }
    if (ch == '?') {
      return s;
    }
  }
  return s_dead;
}

Assistant:

static enum state
parse_url_char_(enum state s, const char ch)
{
  if (ch == ' ' || ch == '\r' || ch == '\n') {
    return s_dead;
  }

#if HTTP_PARSER_STRICT
  if (ch == '\t' || ch == '\f') {
    return s_dead;
  }
#endif

  switch (s) {
    case s_req_spaces_before_url:
      /* Proxied requests are followed by scheme of an absolute URI (alpha).
       * All methods except CONNECT are followed by '/' or '*'.
       */

      if (ch == '/' || ch == '*') {
        return s_req_path;
      }

      if (IS_ALPHA(ch)) {
        return s_req_schema;
      }

      break;

    case s_req_schema:
      if (IS_ALPHA(ch)) {
        return s;
      }

      if (ch == ':') {
        return s_req_schema_slash;
      }

      break;

    case s_req_schema_slash:
      if (ch == '/') {
        return s_req_schema_slash_slash;
      }

      break;

    case s_req_schema_slash_slash:
      if (ch == '/') {
        return s_req_server_start;
      }

      break;

    case s_req_server_with_at:
      if (ch == '@') {
        return s_dead;
      }

    /* FALLTHROUGH */
    case s_req_server_start:
    case s_req_server:
      if (ch == '/') {
        return s_req_path;
      }

      if (ch == '?') {
        return s_req_query_string_start;
      }

      if (ch == '@') {
        return s_req_server_with_at;
      }

      if (IS_USERINFO_CHAR(ch) || ch == '[' || ch == ']') {
        return s_req_server;
      }

      break;

    case s_req_path:
      if (IS_URL_CHAR(ch)) {
        return s;
      }

      switch (ch) {
        case '?':
          return s_req_query_string_start;

        case '#':
          return s_req_fragment_start;
      }

      break;

    case s_req_query_string_start:
    case s_req_query_string:
      if (IS_URL_CHAR(ch)) {
        return s_req_query_string;
      }

      switch (ch) {
        case '?':
          /* allow extra '?' in query string */
          return s_req_query_string;

        case '#':
          return s_req_fragment_start;
      }

      break;

    case s_req_fragment_start:
      if (IS_URL_CHAR(ch)) {
        return s_req_fragment;
      }

      switch (ch) {
        case '?':
          return s_req_fragment;

        case '#':
          return s;
      }

      break;

    case s_req_fragment:
      if (IS_URL_CHAR(ch)) {
        return s;
      }

      switch (ch) {
        case '?':
        case '#':
          return s;
      }

      break;

    default:
      break;
  }

  /* We should never fall out of the switch above unless there's an error */
  return s_dead;
}